

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

void Curl_expire_ex(Curl_easy *data,curltime *nowp,timediff_t milli,expire_id id)

{
  Curl_llist *list;
  curltime *pcVar1;
  int iVar2;
  undefined4 uVar3;
  Curl_multi *pCVar4;
  curl_trc_feat *pcVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  undefined4 uVar9;
  undefined8 uVar10;
  undefined4 uVar11;
  undefined8 uVar12;
  undefined4 uVar13;
  time_node *ptVar14;
  uint uVar15;
  size_t sVar16;
  Curl_llist_node *n;
  void *pvVar17;
  timediff_t tVar18;
  Curl_tree *pCVar19;
  int iVar20;
  Curl_llist_node *n_00;
  time_node *ne;
  long lVar21;
  curltime newer;
  curltime newer_00;
  curltime i;
  curltime newer_01;
  curltime older;
  curltime older_00;
  curltime older_01;
  
  pCVar4 = data->multi;
  if (pCVar4 == (Curl_multi *)0x0) {
    return;
  }
  uVar3 = *(undefined4 *)&nowp->field_0xc;
  iVar20 = ((int)milli + (int)(milli / 1000) * -1000) * 1000;
  iVar2 = nowp->tv_usec + iVar20;
  iVar20 = nowp->tv_usec + -1000000 + iVar20;
  if (iVar2 < 1000000) {
    iVar20 = iVar2;
  }
  lVar21 = (ulong)(999999 < iVar2) + nowp->tv_sec + milli / 1000;
  multi_deltimeout(data,id);
  list = &(data->state).timeoutlist;
  ne = (data->state).expires + id;
  (data->state).expires[id].time.tv_sec = lVar21;
  (data->state).expires[id].time.tv_usec = iVar20;
  *(undefined4 *)&(data->state).expires[id].time.field_0xc = uVar3;
  (data->state).expires[id].eid = id;
  sVar16 = Curl_llist_count(list);
  if (sVar16 == 0) {
    n_00 = (Curl_llist_node *)0x0;
  }
  else {
    n = Curl_llist_head(list);
    if (n != (Curl_llist_node *)0x0) {
      pvVar17 = Curl_node_elem(n);
      ptVar14 = (data->state).expires + id;
      uVar6 = (ptVar14->time).tv_sec;
      uVar7 = (ptVar14->time).tv_usec;
      older.tv_usec = uVar7;
      older.tv_sec = uVar6;
      newer._12_4_ = 0;
      newer._0_12_ = *(undefined1 (*) [12])((long)pvVar17 + 0x20);
      older._12_4_ = 0;
      tVar18 = Curl_timediff(newer,older);
      if (tVar18 < 1) {
        do {
          n_00 = n;
          n = Curl_node_next(n_00);
          if (n == (Curl_llist_node *)0x0) break;
          pvVar17 = Curl_node_elem(n);
          ptVar14 = (data->state).expires + id;
          uVar8 = (ptVar14->time).tv_sec;
          uVar9 = (ptVar14->time).tv_usec;
          older_00.tv_usec = uVar9;
          older_00.tv_sec = uVar8;
          newer_00._12_4_ = 0;
          newer_00._0_12_ = *(undefined1 (*) [12])((long)pvVar17 + 0x20);
          older_00._12_4_ = 0;
          tVar18 = Curl_timediff(newer_00,older_00);
        } while (tVar18 < 1);
        goto LAB_0014936d;
      }
    }
    n_00 = (Curl_llist_node *)0x0;
  }
LAB_0014936d:
  Curl_llist_insert_next(list,n_00,ne,&ne->list);
  pcVar1 = &(data->state).expiretime;
  uVar12 = pcVar1->tv_sec;
  uVar13 = pcVar1->tv_usec;
  older_01.tv_usec = uVar13;
  older_01.tv_sec = uVar12;
  if (pcVar1->tv_sec != 0 || (data->state).expiretime.tv_usec != 0) {
    newer_01.tv_usec = iVar20;
    newer_01.tv_sec = lVar21;
    newer_01._12_4_ = 0;
    older_01._12_4_ = 0;
    tVar18 = Curl_timediff(newer_01,older_01);
    if (0 < tVar18) {
      return;
    }
    uVar15 = Curl_splayremove(pCVar4->timetree,&(data->state).timenode,&pCVar4->timetree);
    if (((uVar15 != 0) && (((data->set).field_0x89f & 0x40) != 0)) &&
       ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 || (0 < pcVar5->log_level)))) {
      Curl_infof(data,"Internal error removing splay node = %d",(ulong)uVar15);
    }
  }
  (data->state).expiretime.tv_sec = lVar21;
  (data->state).expiretime.tv_usec = iVar20;
  *(undefined4 *)&(data->state).expiretime.field_0xc = uVar3;
  pCVar19 = &(data->state).timenode;
  Curl_splayset(pCVar19,data);
  uVar10 = (data->state).expiretime.tv_sec;
  uVar11 = (data->state).expiretime.tv_usec;
  i.tv_usec = uVar11;
  i.tv_sec = uVar10;
  i._12_4_ = 0;
  pCVar19 = Curl_splayinsert(i,pCVar4->timetree,pCVar19);
  pCVar4->timetree = pCVar19;
  return;
}

Assistant:

void Curl_expire_ex(struct Curl_easy *data,
                    const struct curltime *nowp,
                    timediff_t milli, expire_id id)
{
  struct Curl_multi *multi = data->multi;
  struct curltime *curr_expire = &data->state.expiretime;
  struct curltime set;

  /* this is only interesting while there is still an associated multi struct
     remaining! */
  if(!multi)
    return;

  DEBUGASSERT(id < EXPIRE_LAST);

  set = *nowp;
  set.tv_sec += (time_t)(milli/1000); /* might be a 64 to 32 bits conversion */
  set.tv_usec += (int)(milli%1000)*1000;

  if(set.tv_usec >= 1000000) {
    set.tv_sec++;
    set.tv_usec -= 1000000;
  }

  /* Remove any timer with the same id just in case. */
  multi_deltimeout(data, id);

  /* Add it to the timer list. It must stay in the list until it has expired
     in case we need to recompute the minimum timer later. */
  multi_addtimeout(data, &set, id);

  if(curr_expire->tv_sec || curr_expire->tv_usec) {
    /* This means that the struct is added as a node in the splay tree.
       Compare if the new time is earlier, and only remove-old/add-new if it
       is. */
    timediff_t diff = Curl_timediff(set, *curr_expire);
    int rc;

    if(diff > 0) {
      /* The current splay tree entry is sooner than this new expiry time.
         We do not need to update our splay tree entry. */
      return;
    }

    /* Since this is an updated time, we must remove the previous entry from
       the splay tree first and then re-add the new value */
    rc = Curl_splayremove(multi->timetree, &data->state.timenode,
                          &multi->timetree);
    if(rc)
      infof(data, "Internal error removing splay node = %d", rc);
  }

  /* Indicate that we are in the splay tree and insert the new timer expiry
     value since it is our local minimum. */
  *curr_expire = set;
  Curl_splayset(&data->state.timenode, data);
  multi->timetree = Curl_splayinsert(*curr_expire, multi->timetree,
                                     &data->state.timenode);
}